

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlEntityPtr xmlGetDocEntity(xmlDoc *doc,xmlChar *name)

{
  xmlEntitiesTablePtr table;
  xmlEntityPtr cur;
  xmlChar *name_local;
  xmlDoc *doc_local;
  
  if ((doc == (xmlDoc *)0x0) ||
     ((((doc->intSubset == (_xmlDtd *)0x0 || (doc->intSubset->entities == (void *)0x0)) ||
       (doc_local = (xmlDoc *)
                    xmlGetEntityFromTable((xmlEntitiesTablePtr)doc->intSubset->entities,name),
       doc_local == (xmlDoc *)0x0)) &&
      (((doc->standalone == 1 || (doc->extSubset == (_xmlDtd *)0x0)) ||
       ((doc->extSubset->entities == (void *)0x0 ||
        (doc_local = (xmlDoc *)
                     xmlGetEntityFromTable((xmlEntitiesTablePtr)doc->extSubset->entities,name),
        doc_local == (xmlDoc *)0x0)))))))) {
    doc_local = (xmlDoc *)xmlGetPredefinedEntity(name);
  }
  return (xmlEntityPtr)doc_local;
}

Assistant:

xmlEntityPtr
xmlGetDocEntity(const xmlDoc *doc, const xmlChar *name) {
    xmlEntityPtr cur;
    xmlEntitiesTablePtr table;

    if (doc != NULL) {
	if ((doc->intSubset != NULL) && (doc->intSubset->entities != NULL)) {
	    table = (xmlEntitiesTablePtr) doc->intSubset->entities;
	    cur = xmlGetEntityFromTable(table, name);
	    if (cur != NULL)
		return(cur);
	}
	if (doc->standalone != 1) {
	    if ((doc->extSubset != NULL) &&
		(doc->extSubset->entities != NULL)) {
		table = (xmlEntitiesTablePtr) doc->extSubset->entities;
		cur = xmlGetEntityFromTable(table, name);
		if (cur != NULL)
		    return(cur);
	    }
	}
    }
    return(xmlGetPredefinedEntity(name));
}